

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O3

CURLcode libcurl_generate_mime(CURL *curl,GlobalConfig *config,tool_mime *toolmime,int *mimeno)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  CURLcode CVar7;
  int mimeno_00;
  tool_mime *part;
  
  mimeno_00 = (int)mimeno;
  easysrc_mime_count = easysrc_mime_count + 1;
  *(int *)config = easysrc_mime_count;
  CVar7 = easysrc_addf(&easysrc_decl,"curl_mime *mime%d;");
  if ((((CVar7 == CURLE_OK) &&
       (uVar1._0_1_ = config->showerror, uVar1._1_1_ = config->silent,
       uVar1._2_1_ = config->noprogress, uVar1._3_1_ = config->isatty,
       CVar7 = easysrc_addf(&easysrc_data,"mime%d = NULL;",(ulong)uVar1), CVar7 == CURLE_OK)) &&
      (uVar2._0_1_ = config->showerror, uVar2._1_1_ = config->silent,
      uVar2._2_1_ = config->noprogress, uVar2._3_1_ = config->isatty,
      CVar7 = easysrc_addf(&easysrc_code,"mime%d = curl_mime_init(hnd);",(ulong)uVar2),
      CVar7 == CURLE_OK)) &&
     (uVar3._0_1_ = config->showerror, uVar3._1_1_ = config->silent,
     uVar3._2_1_ = config->noprogress, uVar3._3_1_ = config->isatty,
     CVar7 = easysrc_addf(&easysrc_clean,"curl_mime_free(mime%d);",(ulong)uVar3), CVar7 == CURLE_OK)
     ) {
    uVar4._0_1_ = config->showerror;
    uVar4._1_1_ = config->silent;
    uVar4._2_1_ = config->noprogress;
    uVar4._3_1_ = config->isatty;
    CVar7 = easysrc_addf(&easysrc_clean,"mime%d = NULL;",(ulong)uVar4);
    if (((CVar7 == CURLE_OK) && (CVar7 = CURLE_OK, *(long *)(curl + 0x48) != 0)) &&
       (uVar5._0_1_ = config->showerror, uVar5._1_1_ = config->silent,
       uVar5._2_1_ = config->noprogress, uVar5._3_1_ = config->isatty,
       CVar7 = easysrc_addf(&easysrc_decl,"curl_mimepart *part%d;",(ulong)uVar5), CVar7 == CURLE_OK)
       ) {
      uVar6._0_1_ = config->showerror;
      uVar6._1_1_ = config->silent;
      uVar6._2_1_ = config->noprogress;
      uVar6._3_1_ = config->isatty;
      CVar7 = libcurl_generate_mime_part
                        (*(CURL **)(curl + 0x48),(GlobalConfig *)(ulong)uVar6,part,mimeno_00);
      return CVar7;
    }
  }
  return CVar7;
}

Assistant:

static CURLcode libcurl_generate_mime(CURL *curl,
                                      struct GlobalConfig *config,
                                      struct tool_mime *toolmime,
                                      int *mimeno)
{
  CURLcode ret = CURLE_OK;

  /* May need several mime variables, so invent name. */
  *mimeno = ++easysrc_mime_count;
  DECL1("curl_mime *mime%d;", *mimeno);
  DATA1("mime%d = NULL;", *mimeno);
  CODE1("mime%d = curl_mime_init(hnd);", *mimeno);
  CLEAN1("curl_mime_free(mime%d);", *mimeno);
  CLEAN1("mime%d = NULL;", *mimeno);

  if(toolmime->subparts) {
    DECL1("curl_mimepart *part%d;", *mimeno);
    ret = libcurl_generate_mime_part(curl, config,
                                     toolmime->subparts, *mimeno);
  }

nomem:
  return ret;
}